

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.h
# Opt level: O0

void __thiscall
lemon::
VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>::
VectorMap(VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
          *this,GraphType *graph)

{
  DigraphExtender<lemon::SmartDigraphBase> *in_RSI;
  ObserverBase *in_RDI;
  undefined1 in_stack_00000047;
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
  *in_stack_ffffffffffffffa8;
  ObserverBase *in_stack_ffffffffffffffb0;
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
  *this_00;
  Node local_14;
  DigraphExtender<lemon::SmartDigraphBase> *local_10;
  
  local_10 = in_RSI;
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
  ::ObserverBase::ObserverBase((ObserverBase *)0x2c773d);
  in_RDI->_vptr_ObserverBase = (_func_int **)&PTR__VectorMap_00314218;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x2c775e);
  SmartDigraphBase::Node::Node(&local_14);
  DigraphExtender<lemon::SmartDigraphBase>::notifier(local_10,local_14);
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
  ::ObserverBase::attach(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this_00 = (AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
             *)(in_RDI + 1);
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
  ::ObserverBase::notifier(in_RDI);
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
  ::maxId(this_00);
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)this,(size_type)graph,(bool)in_stack_00000047);
  return;
}

Assistant:

VectorMap(const GraphType& graph) {
    Parent::attach(graph.notifier(Item()));
    container.resize(Parent::notifier()->maxId() + 1);
  }